

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_mime_message.c
# Opt level: O3

void usage(void)

{
  putchar(10);
  puts("libcmime - simple api demonstration");
  puts("-----------------------------------");
  puts("demonstrates: parsing an email message ");
  puts("output: output is written to stdout if no output file is specified");
  puts("required parameter: -i /path/to/input_file");
  return;
}

Assistant:

void usage() {
    printf("\n");
    printf("libcmime - simple api demonstration\n");
    printf("-----------------------------------\n");
    printf("demonstrates: parsing an email message \n");
    printf("output: output is written to stdout if no output file is specified\n");
    printf("required parameter: -i /path/to/input_file\n");
}